

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,call_expression *e)

{
  int iVar1;
  bool bVar2;
  void *pvVar3;
  reference *p;
  wostream *pwVar4;
  native_error_exception *this_00;
  wstring_view wVar5;
  __type_identity_t<basic_string_view<wchar_t,_char_traits<wchar_t>_>_> __y;
  object_ptr o;
  wstring_view local_270;
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  value mval;
  _Tuple_impl<0UL,_mjs::value,_mjs::value> local_200;
  wstring_view local_1b0;
  auto_stack_update asu;
  
  eval_call_member((tuple<mjs::value,_mjs::value> *)&local_200,this,
                   (e->member_)._M_t.
                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                   super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value(&mval,this,&local_200.super__Head_base<0UL,_mjs::value,_false>._M_head_impl);
  eval_argument_list(&args,this,&e->arguments_);
  if (mval.type_ == object) {
    pvVar3 = gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
    iVar1 = *(int *)((long)pvVar3 + 0x20);
    this->was_direct_call_to_eval_ = iVar1 < 2;
    if ((local_200.super__Tuple_impl<1UL,_mjs::value>.super__Head_base<1UL,_mjs::value,_false>.
         _M_head_impl.type_ == undefined) &&
       (local_200.super__Head_base<0UL,_mjs::value,_false>._M_head_impl.type_ == reference)) {
      p = value::reference_value(&local_200.super__Head_base<0UL,_mjs::value,_false>._M_head_impl);
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                (&o.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)p);
      if (o.super_gc_heap_ptr_untyped.heap_ != (gc_heap *)0x0) {
        bVar2 = gc_heap_ptr_untyped::has_type<mjs::activation_object>(&o.super_gc_heap_ptr_untyped);
        if (!bVar2) {
          bVar2 = is_global_object(&o);
          if (!bVar2) {
            value::value((value *)&asu,&o);
            value::operator=((value *)&local_200,(value *)&asu);
            value::~value((value *)&asu);
          }
        }
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
      if (1 < iVar1) {
        wVar5 = string::view(&p->property_name_);
        __y._M_str = L"eval";
        __y._M_len = 4;
        bVar2 = std::operator==(wVar5,__y);
        if (bVar2) {
          this->was_direct_call_to_eval_ = true;
        }
      }
    }
    auto_stack_update::auto_stack_update(&asu,this,&(e->super_expression).super_syntax_node.extend_)
    ;
    call_function(__return_storage_ptr__,&mval,(value *)&local_200,&args);
    auto_stack_update::~auto_stack_update(&asu);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&args);
    value::~value(&mval);
    std::_Tuple_impl<0UL,_mjs::value,_mjs::value>::~_Tuple_impl(&local_200);
    return __return_storage_ptr__;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&asu);
  to_string((mjs *)&o,this->heap_,&mval);
  wVar5 = string::view((string *)&o);
  pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     ((wostream *)&asu,wVar5._M_str,wVar5._M_len);
  std::operator<<(pwVar4," is not a function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_((wstring *)&o,this);
  local_270._M_len = o.super_gc_heap_ptr_untyped._8_8_;
  local_270._M_str = (wchar_t *)o.super_gc_heap_ptr_untyped.heap_;
  std::__cxx11::wstringbuf::str();
  native_error_exception::native_error_exception(this_00,type,&local_270,&local_1b0);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value operator()(const call_expression& e) {
        // 11.2.3 The order of these two steps are actually reversed prior to ES5, but it's unlikely to be observable
        auto [member, this_] = eval_call_member(e.member());
        auto mval = get_value(member);
        auto args = eval_argument_list(e.arguments());
        if (mval.type() != value_type::object) {
            std::wostringstream woss;
            woss << to_string(heap_, mval).view() << " is not a function";
            throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
        }
        // See ES5.1, 10.4.2 and 15.1.2.1.1
        const bool is_es5_or_later = global_->language_version() >= version::es5;
        was_direct_call_to_eval_ = !is_es5_or_later;
        if (this_.type() == value_type::undefined && member.type() == value_type::reference) {
            const auto& ref = member.reference_value();
            if (auto o = ref.base(); o && !o.has_type<activation_object>() && !is_global_object(o)) {
                this_ = value{o};
            }
            if (is_es5_or_later && ref.property_name().view() == L"eval") {
                // Meh, may need extra/better check
                was_direct_call_to_eval_ = true;
            }
        }

        auto_stack_update asu{*this, e.extend()};
        return call_function(mval, this_, args);
    }